

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          FixedArray<char,_1UL> *params_3)

{
  size_t sVar1;
  long lVar2;
  size_t size;
  char *__dest;
  long local_50 [4];
  
  local_50[0] = *(long *)(this + 8);
  local_50[1] = params->size_;
  local_50[2] = params_1->size_;
  local_50[3] = 1;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_50 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)this,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = params->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = params_1->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params_1->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  *__dest = *(char *)&params_2->ptr;
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}